

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc_error_estimator.cpp
# Opt level: O2

float __thiscall ltc_error_estimator::estimate_error(ltc_error_estimator *this,vec3 parameters)

{
  int i;
  int iVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double local_e8;
  anon_union_12_3_e2189aaa_for_vec<3,_float,_(glm::precision)0>_3 local_e0;
  double local_d0;
  vec2 random_sample;
  halton_sampler2d sampler2d;
  ltc ltc;
  
  local_e0.field_0.z = (float)parameters.field_0._8_4_;
  local_e0._0_8_ = parameters.field_0._0_8_;
  if (this->_force_isotropy == true) {
    local_e0.field_0.y = (float)parameters.field_0._0_4_;
    local_e0.field_0.x = (float)parameters.field_0._0_4_;
    local_e0.field_0.z = 0.0;
  }
  ::ltc::ltc(&ltc);
  ::ltc::set_amplitude(&ltc,this->_amplitude);
  ::ltc::set_base_frame(&ltc,&this->_base_frame);
  ::ltc::set_ltc_parameters(&ltc,(vec3 *)&local_e0.field_0);
  sampler2d._0_8_ = &PTR__sampler2d_001c4b88;
  sampler2d._currentIndex = 0;
  local_e8 = 0.0;
  for (iVar1 = 0; iVar1 != 0x20; iVar1 = iVar1 + 1) {
    iVar2 = 0x20;
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      random_sample = halton_sampler2d::getNextSample(&sampler2d);
      local_d0 = estimate_partial_error(this,&ltc.super_brdf,this->_brdf,&random_sample);
      dVar4 = estimate_partial_error(this,this->_brdf,&ltc.super_brdf,&random_sample);
      local_e8 = local_e8 + local_d0 + dVar4;
    }
  }
  return (float)(local_e8 * 0.0009765625);
}

Assistant:

float ltc_error_estimator::estimate_error(glm::vec3 parameters) const
{
  const int num_samples = 32;

  if (_force_isotropy)
  {
    parameters.y = parameters.x;
    parameters.z = 0.0f;
  }

  double total_error = 0.0f;

  ltc ltc;
  ltc.set_amplitude(_amplitude);
  ltc.set_base_frame(_base_frame);
  ltc.set_ltc_parameters(parameters);

  halton_sampler2d sampler2d;
  for (auto i = 0; i < num_samples; ++i)
  {
    for (auto j = 0; j < num_samples; ++j)
    {
      const auto random_sample = sampler2d.getNextSample();

      total_error += estimate_partial_error(ltc, _brdf, random_sample);
      total_error += estimate_partial_error(_brdf, ltc, random_sample);
    }
  }

  float final_error = static_cast<float>(total_error / static_cast<double>(num_samples * num_samples));
  return final_error;
}